

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall trompeloeil::trace_agent::trace_exception(trace_agent *this)

{
  tracer *ptVar1;
  char *pcVar2;
  unsigned_long uVar3;
  string asStack_78 [32];
  trace_agent *ptStack_58;
  undefined1 *puStack_50;
  trace_agent *local_30;
  exception *e;
  trace_agent *local_10;
  trace_agent *this_local;
  
  if (this->t != (tracer *)0x0) {
    puStack_50 = (undefined1 *)0x181bf4;
    local_30 = this;
    local_10 = this;
    __cxa_rethrow();
    ptStack_58 = this;
    puStack_50 = (undefined1 *)&this_local;
    if (this->t != (tracer *)0x0) {
      ptVar1 = this->t;
      pcVar2 = (this->loc).file;
      uVar3 = (this->loc).line;
      puStack_50 = (undefined1 *)&this_local;
      std::__cxx11::ostringstream::str();
      (*(code *)**(undefined8 **)ptVar1)(ptVar1,pcVar2,uVar3,asStack_78);
      std::__cxx11::string::~string(asStack_78);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->os);
    return;
  }
  return;
}

Assistant:

void
    trace_exception()
    {
      if (t)
      {
        try {
          throw;
        }
        catch (std::exception& e)
        {
          os << "threw exception: what() = " << e.what() << '\n';
        }
        catch (...)
        {
          os << "threw unknown exception\n";
        }
      }
    }